

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O1

int base64_stream_decode_avx(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  undefined1 auVar1 [16];
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  uint uVar11;
  int iVar12;
  size_t sVar13;
  bool bVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  size_t sVar18;
  size_t sVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __m128i lo;
  
  iVar12 = state->eof;
  if (iVar12 != 0) {
    *outlen = 0;
    if (iVar12 == 1 && srclen != 0) {
      state->eof = 2;
      state->bytes = 0;
      bVar14 = srclen == 1 && base64_table_dec_8bit[(byte)*src] == 0xfe;
    }
    else {
      bVar14 = false;
    }
    goto LAB_00106e7f;
  }
  bVar16 = state->carry;
  sVar19 = (size_t)(uint)state->bytes;
  iVar12 = 0;
  sVar18 = 0;
  sVar13 = srclen;
  uVar11 = state->bytes;
  switch(sVar19) {
  case 0:
    do {
      auVar9 = _DAT_0010c050;
      auVar8 = _DAT_0010c010;
      auVar4 = _DAT_0010bff0;
      if (0x17 < srclen) {
        uVar20 = srclen - 8 >> 4;
        auVar22._8_4_ = 0xf2f2f2f;
        auVar22._0_8_ = 0xf2f2f2f0f2f2f2f;
        auVar22._12_4_ = 0xf2f2f2f;
        auVar23._8_4_ = 0x2f2f2f2f;
        auVar23._0_8_ = 0x2f2f2f2f2f2f2f2f;
        auVar23._12_4_ = 0x2f2f2f2f;
        auVar24._8_4_ = 0x1400140;
        auVar24._0_8_ = 0x140014001400140;
        auVar24._12_4_ = 0x1400140;
        auVar25._8_4_ = 0x11000;
        auVar25._0_8_ = 0x1100000011000;
        auVar25._12_4_ = 0x11000;
        uVar15 = uVar20;
LAB_00106959:
        auVar21 = SUB6416(ZEXT864(0xb9b9bfbf04131000),0);
        if (7 < uVar15) {
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]
             ) {
            auVar5 = vpcmpeqb_avx(auVar1,auVar23);
            auVar26 = vpaddb_avx(auVar26,auVar5);
            auVar26 = vpshufb_avx(auVar21,auVar26);
            auVar1 = vpaddb_avx(auVar26,auVar1);
            auVar1 = vpmaddubsw_avx(auVar1,auVar24);
            auVar1 = vpmaddwd_avx(auVar1,auVar25);
            auVar1 = vpshufb_avx(auVar1,auVar9);
            *(undefined1 (*) [16])out = auVar1;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar15 = uVar15 - 1;
          }
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar3[0xf] < '\0') goto LAB_00106d35;
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]
             ) {
            auVar5 = vpcmpeqb_avx(auVar1,auVar23);
            auVar26 = vpaddb_avx(auVar26,auVar5);
            auVar26 = vpshufb_avx(auVar21,auVar26);
            auVar1 = vpaddb_avx(auVar26,auVar1);
            auVar1 = vpmaddubsw_avx(auVar1,auVar24);
            auVar1 = vpmaddwd_avx(auVar1,auVar25);
            auVar1 = vpshufb_avx(auVar1,auVar9);
            *(undefined1 (*) [16])out = auVar1;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar15 = uVar15 - 1;
          }
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar3[0xf] < '\0') goto LAB_00106d35;
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]
             ) {
            auVar5 = vpcmpeqb_avx(auVar1,auVar23);
            auVar26 = vpaddb_avx(auVar26,auVar5);
            auVar26 = vpshufb_avx(auVar21,auVar26);
            auVar1 = vpaddb_avx(auVar26,auVar1);
            auVar1 = vpmaddubsw_avx(auVar1,auVar24);
            auVar1 = vpmaddwd_avx(auVar1,auVar25);
            auVar1 = vpshufb_avx(auVar1,auVar9);
            *(undefined1 (*) [16])out = auVar1;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar15 = uVar15 - 1;
          }
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar3[0xf] < '\0') goto LAB_00106d35;
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]
             ) {
            auVar5 = vpcmpeqb_avx(auVar1,auVar23);
            auVar26 = vpaddb_avx(auVar26,auVar5);
            auVar26 = vpshufb_avx(auVar21,auVar26);
            auVar1 = vpaddb_avx(auVar26,auVar1);
            auVar1 = vpmaddubsw_avx(auVar1,auVar24);
            auVar1 = vpmaddwd_avx(auVar1,auVar25);
            auVar1 = vpshufb_avx(auVar1,auVar9);
            *(undefined1 (*) [16])out = auVar1;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar15 = uVar15 - 1;
          }
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar3[0xf] < '\0') goto LAB_00106d35;
LAB_00106b0a:
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]
             ) {
            auVar5 = vpcmpeqb_avx(auVar1,auVar23);
            auVar26 = vpaddb_avx(auVar26,auVar5);
            auVar26 = vpshufb_avx(auVar21,auVar26);
            auVar1 = vpaddb_avx(auVar26,auVar1);
            auVar1 = vpmaddubsw_avx(auVar1,auVar24);
            auVar1 = vpmaddwd_avx(auVar1,auVar25);
            auVar1 = vpshufb_avx(auVar1,auVar9);
            *(undefined1 (*) [16])out = auVar1;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar15 = uVar15 - 1;
          }
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar3[0xf] < '\0') goto LAB_00106d35;
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]
             ) {
            auVar5 = vpcmpeqb_avx(auVar1,auVar23);
            auVar26 = vpaddb_avx(auVar26,auVar5);
            auVar26 = vpshufb_avx(auVar21,auVar26);
            auVar1 = vpaddb_avx(auVar26,auVar1);
            auVar1 = vpmaddubsw_avx(auVar1,auVar24);
            auVar1 = vpmaddwd_avx(auVar1,auVar25);
            auVar1 = vpshufb_avx(auVar1,auVar9);
            *(undefined1 (*) [16])out = auVar1;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar15 = uVar15 - 1;
          }
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar3[0xf] < '\0') goto LAB_00106d35;
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          uVar6 = (ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar3[0xf] >> 7) << 0xf;
joined_r0x00106ce7:
          if (uVar6 != 0) goto LAB_00106d35;
          auVar3 = vpcmpeqb_avx(auVar1,auVar23);
          auVar26 = vpaddb_avx(auVar26,auVar3);
          auVar26 = vpshufb_avx(auVar21,auVar26);
          auVar1 = vpaddb_avx(auVar26,auVar1);
          auVar1 = vpmaddubsw_avx(auVar1,auVar24);
          auVar1 = vpmaddwd_avx(auVar1,auVar25);
          auVar1 = vpshufb_avx(auVar1,auVar9);
          *(undefined1 (*) [16])out = auVar1;
          src = (char *)((long)src + 0x10);
          out = *(undefined1 (*) [16])out + 0xc;
          auVar1 = *(undefined1 (*) [16])src;
          auVar26 = vpsrld_avx(auVar1,4);
          auVar26 = vpand_avx(auVar26,auVar22);
          auVar5 = vpshufb_avx(auVar4,auVar26);
          auVar3 = vpand_avx(auVar1,auVar23);
          auVar3 = vpshufb_avx(auVar8,auVar3);
          auVar3 = vpand_avx(auVar3,auVar5);
          auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
          uVar10 = uVar15 - 1;
          if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar3 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar3 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar3 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar3 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar3 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar3 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar3 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf]
             ) {
            auVar5 = vpcmpeqb_avx(auVar1,auVar23);
            auVar26 = vpaddb_avx(auVar26,auVar5);
            auVar21 = vpshufb_avx(auVar21,auVar26);
            auVar21 = vpaddb_avx(auVar21,auVar1);
            auVar21 = vpmaddubsw_avx(auVar21,auVar24);
            auVar21 = vpmaddwd_avx(auVar21,auVar25);
            auVar21 = vpshufb_avx(auVar21,auVar9);
            *(undefined1 (*) [16])out = auVar21;
            src = (char *)((long)src + 0x10);
            out = *(undefined1 (*) [16])out + 0xc;
            uVar10 = uVar15 - 2;
          }
          uVar15 = uVar10;
          if (((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                            (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar3 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar3 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar3 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar3 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               auVar3[0xf] < '\0') || (uVar15 == 0)) goto LAB_00106d35;
          goto LAB_00106959;
        }
        if (3 < uVar15) goto LAB_00106b0a;
        auVar1 = *(undefined1 (*) [16])src;
        auVar26 = vpsrld_avx(auVar1,4);
        auVar26 = vpand_avx(auVar26,auVar22);
        auVar5 = vpshufb_avx(auVar4,auVar26);
        auVar3 = vpand_avx(auVar1,auVar23);
        auVar3 = vpshufb_avx(auVar8,auVar3);
        auVar3 = vpand_avx(auVar3,auVar5);
        auVar3 = vpcmpgtb_avx(auVar3,(undefined1  [16])0x0);
        uVar6 = (ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf;
        if (1 < uVar15) goto joined_r0x00106ce7;
        if (uVar6 == 0) {
          auVar4 = vpcmpeqb_avx(auVar1,_DAT_0010c000);
          auVar4 = vpaddb_avx(auVar26,auVar4);
          auVar4 = vpshufb_avx(auVar21,auVar4);
          auVar4 = vpaddb_avx(auVar1,auVar4);
          auVar4 = vpmaddubsw_avx(auVar4,_DAT_0010c030);
          auVar4 = vpmaddwd_avx(auVar4,_DAT_0010c040);
          auVar4 = vpshufb_avx(auVar4,_DAT_0010c050);
          *(undefined1 (*) [16])out = auVar4;
          src = (char *)((long)src + 0x10);
          out = *(undefined1 (*) [16])out + 0xc;
          uVar15 = uVar15 - 1;
        }
LAB_00106d35:
        srclen = (srclen - (srclen - 8 & 0xfffffffffffffff0)) + uVar15 * 0x10;
        sVar19 = sVar19 + (uVar20 - uVar15) * 0xc;
      }
      bVar14 = srclen == 0;
      srclen = srclen - 1;
      if (bVar14) {
        uVar17 = 0;
        bVar14 = true;
        iVar12 = 0;
        break;
      }
      puVar7 = *(undefined1 (*) [16])src;
      if (0xfd < base64_table_dec_8bit[(byte)*puVar7]) {
        bVar14 = false;
        goto LAB_00106e6f;
      }
      src = *(undefined1 (*) [16])src + 1;
      bVar16 = base64_table_dec_8bit[(byte)*puVar7] << 2;
      sVar18 = sVar19;
switchD_001068c8_caseD_1:
      uVar17 = 1;
      sVar13 = srclen - 1;
      sVar19 = sVar18;
      if (srclen == 0) {
LAB_00106e21:
        bVar14 = true;
        break;
      }
      bVar2 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar2) {
        iVar12 = 2;
        uVar11 = 1;
        goto switchD_001068c8_default;
      }
      src = (char *)((byte *)src + 1);
      (*(undefined1 (*) [16])out)[0] = bVar2 >> 4 | bVar16;
      out = *(undefined1 (*) [16])out + 1;
      bVar16 = bVar2 << 4;
      sVar18 = sVar18 + 1;
switchD_001068c8_caseD_2:
      bVar14 = true;
      srclen = sVar13 - 1;
      sVar19 = sVar18;
      if (sVar13 == 0) {
        uVar17 = 2;
        break;
      }
      bVar2 = *src;
      src = (char *)((byte *)src + 1);
      bVar2 = base64_table_dec_8bit[bVar2];
      if (0xfd < bVar2) {
        iVar12 = 0;
        uVar17 = 3;
        uVar11 = 3;
        if (bVar2 != 0xfe) goto switchD_001068c8_default;
        if (srclen != 0) {
          bVar2 = base64_table_dec_8bit[(byte)*src];
          bVar14 = sVar13 == 2;
          goto LAB_00106e5c;
        }
        iVar12 = 1;
        break;
      }
      *out = bVar2 >> 2 | bVar16;
      out = (char *)((byte *)out + 1);
      bVar16 = bVar2 << 6;
      sVar18 = sVar18 + 1;
switchD_001068c8_caseD_3:
      bVar14 = srclen == 0;
      srclen = srclen - 1;
      sVar19 = sVar18;
      if (bVar14) {
        uVar17 = 3;
        goto LAB_00106e21;
      }
      bVar2 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar2) goto code_r0x00106e13;
      src = (char *)((byte *)src + 1);
      *out = bVar2 | bVar16;
      out = (char *)((byte *)out + 1);
      sVar19 = sVar18 + 1;
      bVar16 = 0;
    } while( true );
  case 1:
    goto switchD_001068c8_caseD_1;
  case 2:
    goto switchD_001068c8_caseD_2;
  case 3:
    goto switchD_001068c8_caseD_3;
  default:
switchD_001068c8_default:
    uVar17 = uVar11;
    bVar14 = false;
    sVar19 = sVar18;
  }
  goto LAB_00106e72;
code_r0x00106e13:
  bVar14 = srclen == 0;
LAB_00106e5c:
  bVar14 = (bool)(bVar14 & bVar2 == 0xfe);
LAB_00106e6f:
  iVar12 = 2;
  uVar17 = 0;
LAB_00106e72:
  state->eof = iVar12;
  state->bytes = uVar17;
  state->carry = bVar16;
  *outlen = sVar19;
LAB_00106e7f:
  return (int)bVar14;
}

Assistant:

BASE64_DEC_FUNCTION(avx)
{
#if HAVE_AVX
	#include "../generic/dec_head.c"
	dec_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/dec_tail.c"
#else
	BASE64_DEC_STUB
#endif
}